

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rifiuti-vista.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int64_t win_filetime;
  metarecord *pmVar2;
  _Bool _Var3;
  GQuark GVar4;
  uint uVar5;
  exitcode eVar6;
  int iVar7;
  undefined8 uVar8;
  GError *pGVar9;
  undefined8 uVar10;
  undefined8 *puVar11;
  GDateTime *pGVar12;
  long lVar13;
  undefined8 *puVar14;
  size_t sVar15;
  ulong uVar16;
  undefined8 uVar17;
  byte bVar18;
  ulong *puVar19;
  code *pcVar20;
  char *pcVar21;
  GPtrArray *pGVar22;
  GError **ppGVar23;
  GError *error;
  ulong uStack_90;
  undefined8 uStack_88;
  ulong *puStack_80;
  ulong uStack_78;
  int iStack_70;
  undefined4 uStack_6c;
  undefined8 *puStack_68;
  GQuark GStack_5c;
  long lStack_58;
  ulong *puStack_50;
  ulong uStack_48;
  GError *local_18;
  char **local_10;
  
  ppGVar23 = &local_18;
  local_18 = (GError *)0x0;
  local_10 = argv;
  _Var3 = rifiuti_init(RECYCLE_BIN_TYPE_DIR,"DIR_OR_FILE",
                       "Parse index files in C:\\$Recycle.bin style folder and dump recycle bin data.  Can also dump a single index file."
                       ,&local_10,&local_18);
  if (!_Var3) goto LAB_00103b64;
  do_parse_records(_parse_record_cb);
  pGVar22 = meta->records;
  if (pGVar22->len == 0) {
    iVar7 = g_hash_table_size(meta->invalid_records);
    if (iVar7 == 0) {
      pGVar22 = meta->records;
      goto LAB_00103a83;
    }
    GVar4 = rifiuti_fatal_error_quark();
    pcVar21 = "No valid recycle bin record found";
LAB_00103aee:
    uVar8 = dcgettext(0,pcVar21,5);
    g_set_error_literal(&local_18,GVar4,1,uVar8);
LAB_00103b64:
    eVar6 = rifiuti_cleanup(&local_18);
    return eVar6;
  }
LAB_00103a83:
  pcVar20 = _sort_record_by_time;
  g_ptr_array_sort(pGVar22);
  pmVar2 = meta;
  pGVar22 = meta->records;
  if (pGVar22->len == 0) {
    meta->version = -1;
  }
  else {
    meta->version = **pGVar22->pdata;
    pcVar20 = _compare_idx_versions;
    g_ptr_array_foreach(pGVar22,_compare_idx_versions,pmVar2);
    if (pmVar2->version == -2) {
      GVar4 = rifiuti_fatal_error_quark();
      pcVar21 = 
      "Index files from multiple Windows versions are mixed together.  Please check each file individually."
      ;
      goto LAB_00103aee;
    }
  }
  _Var3 = dump_content(&local_18);
  if (_Var3) goto LAB_00103b64;
  uVar1 = local_18->domain;
  uVar5 = g_file_error_quark();
  if (uVar1 == uVar5) {
    GVar4 = rifiuti_fatal_error_quark();
    uVar8 = g_strdup(local_18->message);
    pGVar9 = (GError *)g_error_new_literal(GVar4,2,uVar8);
    g_error_free(local_18);
    local_18 = pGVar9;
    goto LAB_00103b64;
  }
  main_cold_1();
  uStack_88 = 0;
  uStack_48 = (ulong)uVar1;
  uVar8 = g_path_get_basename();
  puStack_80 = (ulong *)0x0;
  if ((ppGVar23 == (GError **)0x0) || (*(char *)ppGVar23 == '\0')) {
    g_return_if_fail_warning("rifiuti2","_validate_index_file","filename && *filename");
    goto LAB_00103ff0;
  }
  g_log("rifiuti2",0x80,"Start file validation for \'%s\'...",ppGVar23);
  iVar7 = g_file_get_contents(ppGVar23,&puStack_80,&iStack_70,&uStack_88);
  if (iVar7 != 0) {
    if (0x18 < CONCAT44(uStack_6c,iStack_70)) {
      uVar16 = *puStack_80;
      g_log("rifiuti2",0x80,"version = %lu",uVar16);
      puVar19 = puStack_80;
      if (uVar16 == 1) {
        g_log("rifiuti2",0x80,"Finished file validation for \'%s\'",ppGVar23);
        g_log("rifiuti2",0x80,"Start populating record for \'%s\'...",uVar8);
        puVar11 = (undefined8 *)g_malloc0(0x50);
        lStack_58 = (long)puVar19 + (0x18 - (ulong)(CONCAT44(uStack_6c,iStack_70) == 0x21f));
        *puVar11 = 1;
        if (CONCAT44(uStack_6c,iStack_70) == 0x21f) {
          puVar14 = puVar11 + 5;
          uVar16 = puVar19[1];
          *(undefined4 *)((long)puVar11 + 0x2b) = *(undefined4 *)((long)puVar19 + 0xb);
          *(int *)puVar14 = (int)uVar16;
          g_log("rifiuti2",0x80,"filesize field broken, 56 bit only, val=0x%lX",*puVar14);
          *puVar14 = 0xffffffffffffffff;
          uStack_78 = 0x208;
          bVar18 = 1;
          uStack_90 = 0x208;
        }
        else {
          uStack_78 = (ulong)(iStack_70 - 0x18);
          uStack_90 = 0x208;
LAB_00103e36:
          puVar11[5] = puVar19[1];
          bVar18 = 0;
          g_log("rifiuti2",0x80,"deleted file size = %lu");
        }
        puStack_50 = puVar19;
        win_filetime = *(int64_t *)((long)puVar19 + (0x10 - (ulong)bVar18));
        puVar11[4] = win_filetime;
        pGVar12 = win_filetime_to_gdatetime(win_filetime);
        puVar11[3] = pGVar12;
        puStack_68 = puVar11 + 9;
        if (puVar11[9] == 0) {
          uVar10 = g_date_time_new_now_utc();
          lVar13 = g_date_time_difference(puVar11[3],uVar10);
          if ((0x1f540500 < lVar13) || (iVar7 = g_date_time_get_year(puVar11[3]), iVar7 < 0x7d7)) {
            GStack_5c = rifiuti_record_error_quark();
            uVar17 = dcgettext(0,"File deletion time is suspicious or broken",5);
            g_set_error_literal(puStack_68,GStack_5c,1,uVar17);
          }
          g_date_time_unref(uVar10);
        }
        if ((uint)uStack_90 < (uint)uStack_78) {
          pcVar21 = "Ignored dangling extraneous data after record";
        }
        else {
          if (bVar18 != 0 || (uint)uStack_90 <= (uint)uStack_78) goto LAB_00103f45;
          pcVar21 = "Record is truncated, thus unicode path might be incomplete";
        }
        GVar4 = rifiuti_record_error_quark();
        uVar10 = dcgettext(0,pcVar21,5);
        g_set_error_literal(puStack_68,GVar4,2,uVar10);
LAB_00103f45:
        if ((uint)uStack_78 < (uint)uStack_90) {
          uStack_90 = uStack_78;
        }
        puVar14 = (undefined8 *)g_string_new_len(lStack_58,uStack_90 & 0xffffffff);
        puVar11[6] = puVar14;
        sVar15 = ucs2_bytelen((char *)*puVar14,puVar14[1]);
        puVar19 = puStack_50;
        if (puVar11[9] == 0) {
          lVar13 = g_convert(*puVar14,sVar15,"UTF-8","UTF-16LE",0,0,0);
          if (lVar13 == 0) {
            GVar4 = rifiuti_record_error_quark();
            uVar10 = dcgettext(0,"Path contains broken unicode character(s)",5);
            puVar19 = puStack_50;
            g_set_error_literal(puStack_68,GVar4,3,uVar10);
          }
          else {
            g_free(lVar13);
          }
        }
        g_free(puVar19);
        if (isolated_index == true) {
          *(undefined4 *)(puVar11 + 8) = 0;
        }
        else {
          uVar10 = g_path_get_dirname(ppGVar23);
          lVar13 = g_strdup(uVar8);
          *(undefined1 *)(lVar13 + 1) = 0x52;
          uVar17 = g_build_filename(uVar10,lVar13,0);
          iVar7 = g_file_test(uVar17,0x10);
          *(uint *)(puVar11 + 8) = (iVar7 == 0) + 1;
          g_free(uVar10);
          g_free(lVar13);
          g_free(uVar17);
        }
        puVar11[2] = uVar8;
        g_ptr_array_add(*(undefined8 *)(pcVar20 + 0x28),puVar11);
        iVar7 = g_log("rifiuti2",0x80,"Parsing done for \'%s\'",uVar8);
        return iVar7;
      }
      if (uVar16 != 2) {
        GVar4 = rifiuti_record_error_quark();
        if (uVar16 < 10) {
          pcVar21 = (char *)dcgettext(0,"Index file version %lu is unsupported",5);
        }
        else {
          uVar16 = dcgettext(0,"File is not a $Recycle.bin index",5);
          pcVar21 = "%s";
        }
        g_set_error(&uStack_88,GVar4,5,pcVar21,uVar16);
        goto LAB_00103fe6;
      }
      if (0x1c < CONCAT44(uStack_6c,iStack_70)) {
        g_log("rifiuti2",0x80,"Finished file validation for \'%s\'",ppGVar23);
        g_log("rifiuti2",0x80,"Start populating record for \'%s\'...",uVar8);
        uStack_90 = (ulong)(uint)((int)puVar19[3] * 2);
        uStack_78 = (ulong)(iStack_70 - 0x1c);
        lStack_58 = (long)puVar19 + 0x1c;
        puVar11 = (undefined8 *)g_malloc0(0x50);
        *puVar11 = 2;
        goto LAB_00103e36;
      }
    }
    GVar4 = rifiuti_record_error_quark();
    uVar10 = dcgettext(0,"File is not a $Recycle.bin index",5);
    g_set_error_literal(&uStack_88,GVar4,4,uVar10);
  }
LAB_00103fe6:
  g_free(puStack_80);
LAB_00103ff0:
  uVar10 = *(undefined8 *)(pcVar20 + 0x30);
  uVar17 = g_strdup(uVar8);
  g_hash_table_replace(uVar10,uVar17,uStack_88);
  iVar7 = g_free(uVar8);
  return iVar7;
}

Assistant:

int
main (int    argc,
      char **argv)
{
    GError *error = NULL;

    UNUSED (argc);

    if (! rifiuti_init (
        RECYCLE_BIN_TYPE_DIR,
        N_("DIR_OR_FILE"),
        N_("Parse index files in C:\\$Recycle.bin style "
           "folder and dump recycle bin data.  "
           "Can also dump a single index file."),
        &argv, &error
    ))
        goto cleanup;

    do_parse_records (&_parse_record_cb);

    if (! meta->records->len && g_hash_table_size (meta->invalid_records))
    {
        g_set_error_literal (&error, R2_FATAL_ERROR,
            R2_FATAL_ERROR_ILLEGAL_DATA,
            _("No valid recycle bin record found"));
        goto cleanup;
    }

    g_ptr_array_sort (meta->records, _sort_record_by_time);
    if (! _set_overall_rbin_version (meta))
    {
        g_set_error_literal (&error, R2_FATAL_ERROR,
            R2_FATAL_ERROR_ILLEGAL_DATA,
            _("Index files from multiple Windows versions are mixed together."
            "  Please check each file individually."));
        goto cleanup;
    }

    if (! dump_content (&error))
    {
        g_assert (error->domain == G_FILE_ERROR);
        GError *new_err = g_error_new_literal (
            R2_FATAL_ERROR, R2_FATAL_ERROR_TEMPFILE,
            g_strdup (error->message));
        g_error_free (error);
        error = new_err;
    }

    cleanup:

    return rifiuti_cleanup (&error);
}